

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

void kj::UnixEventPort::captureSignal(int signum)

{
  Fault f;
  int signum_local;
  
  signum_local = signum;
  if ((anonymous_namespace)::reservedSignal == 10) {
    if (signum == 10) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[144]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0xf2,FAILED,"signum != SIGUSR1",
                 "\"Sorry, SIGUSR1 is reserved by the UnixEventPort implementation.  You may call \" \"UnixEventPort::setReservedSignal() to reserve a different signal.\""
                 ,(char (*) [144])
                  "Sorry, SIGUSR1 is reserved by the UnixEventPort implementation.  You may call UnixEventPort::setReservedSignal() to reserve a different signal."
                );
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  else if ((anonymous_namespace)::reservedSignal == signum) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[57],int&>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xf5,FAILED,"signum != reservedSignal",
               "\"Can\'t capture signal reserved using setReservedSignal().\", signum",
               (char (*) [57])"Can\'t capture signal reserved using setReservedSignal().",
               &signum_local);
    kj::_::Debug::Fault::fatal(&f);
  }
  anon_unknown_6::registerSignalHandler(signum);
  return;
}

Assistant:

void UnixEventPort::captureSignal(int signum) {
  if (reservedSignal == SIGUSR1) {
    KJ_REQUIRE(signum != SIGUSR1,
               "Sorry, SIGUSR1 is reserved by the UnixEventPort implementation.  You may call "
               "UnixEventPort::setReservedSignal() to reserve a different signal.");
  } else {
    KJ_REQUIRE(signum != reservedSignal,
               "Can't capture signal reserved using setReservedSignal().", signum);
  }
  registerSignalHandler(signum);
}